

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnElemSegment
          (SharedValidator *this,Location *loc,Var *table_var,SegmentKind kind)

{
  Type local_bc;
  ElemType local_b4;
  Var local_a0;
  Enum local_54;
  undefined1 local_50 [8];
  TableType table_type;
  SegmentKind kind_local;
  Var *table_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  table_type.limits._20_4_ = kind;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  TableType::TableType((TableType *)local_50);
  if (table_type.limits._20_4_ == 0) {
    Var::Var(&local_a0,table_var);
    local_54 = (Enum)CheckTableIndex(this,&local_a0,(TableType *)local_50);
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_54);
    Var::~Var(&local_a0);
  }
  Type::Type(&local_bc,Void);
  ElemType::ElemType(&local_b4,local_bc,table_type.limits._20_4_ == 0,(Type)local_50);
  std::vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>::
  push_back(&this->elems_,&local_b4);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnElemSegment(const Location& loc,
                                      Var table_var,
                                      SegmentKind kind) {
  Result result = Result::Ok;
  TableType table_type;
  if (kind == SegmentKind::Active) {
    result |= CheckTableIndex(table_var, &table_type);
  }
  // Type gets set later in OnElemSegmentElemType.
  elems_.push_back(
      ElemType{Type::Void, kind == SegmentKind::Active, table_type.element});
  return result;
}